

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  IOSystem *pIVar1;
  ProgressHandler *pPVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Logger *pLVar6;
  size_type sVar7;
  reference ppBVar8;
  IOStream *pIVar9;
  undefined4 extraout_var;
  aiScene *paVar10;
  string *psVar11;
  pointer pPVar12;
  ulong uVar13;
  pointer local_328;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  ScenePreprocessor local_288;
  ScenePreprocessor pre;
  string local_278;
  undefined1 local_258 [8];
  ValidateDSProcess ds;
  string local_230;
  allocator<char> local_209;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  undefined1 local_1a0 [8];
  string ext;
  aiImporterDesc *desc;
  uint32_t fileSize;
  IOStream *local_150;
  IOStream *fileIO;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  uint local_104;
  long lStack_100;
  uint a_1;
  size_type s;
  value_type pBStack_f0;
  uint a;
  BaseImporter *imp;
  string local_e0;
  undefined1 local_b9;
  Profiler *local_b8;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  local_b0;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string pFile;
  uint pFlags_local;
  char *_pFile_local;
  Importer *this_local;
  
  pFile.field_2._12_4_ = pFlags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,_pFile,&local_49);
  std::allocator<char>::~allocator(&local_49);
  WriteLogOpening((string *)local_48);
  if (this->pimpl->mScene != (aiScene *)0x0) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"(Deleting previous scene)");
    FreeScene(this);
  }
  bVar3 = IOSystem::Exists(this->pimpl->mIOHandler,(string *)local_48);
  if (!bVar3) {
    std::operator+(&local_a0,"Unable to open file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_80,&local_a0,"\".");
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,&this->pimpl->mErrorString);
    this_local = (Importer *)0x0;
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 1;
    goto LAB_003c1fe3;
  }
  local_b9 = 0;
  iVar4 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
  if (iVar4 == 0) {
    local_328 = (pointer)0x0;
  }
  else {
    local_328 = (pointer)operator_new(0x30);
    local_b9 = 1;
    local_b8 = local_328;
    Profiling::Profiler::Profiler(local_328);
  }
  std::unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>::
  unique_ptr<std::default_delete<Assimp::Profiling::Profiler>,void>
            ((unique_ptr<Assimp::Profiling::Profiler,std::default_delete<Assimp::Profiling::Profiler>>
              *)&local_b0,local_328);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
  if (bVar3) {
    pPVar12 = std::
              unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
              ::operator->(&local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"total",(allocator<char> *)((long)&imp + 7));
    Profiling::Profiler::BeginRegion(pPVar12,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&imp + 7));
  }
  pBStack_f0 = (value_type)0x0;
  SetPropertyInteger(this,"importerIndex",-1);
  for (s._4_4_ = 0; uVar13 = (ulong)s._4_4_,
      sVar7 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::size
                        (&this->pimpl->mImporter), uVar13 < sVar7; s._4_4_ = s._4_4_ + 1) {
    ppBVar8 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
              operator[](&this->pimpl->mImporter,(ulong)s._4_4_);
    uVar5 = (*(*ppBVar8)->_vptr_BaseImporter[3])(*ppBVar8,local_48,this->pimpl->mIOHandler,0);
    if ((uVar5 & 1) != 0) {
      ppBVar8 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
                operator[](&this->pimpl->mImporter,(ulong)s._4_4_);
      pBStack_f0 = *ppBVar8;
      SetPropertyInteger(this,"importerIndex",s._4_4_);
      break;
    }
  }
  if (pBStack_f0 == (value_type)0x0) {
    lStack_100 = std::__cxx11::string::find_last_of((char)local_48,0x2e);
    if (lStack_100 != -1) {
      pLVar6 = DefaultLogger::get();
      Logger::info(pLVar6,"File extension not known, trying signature-based detection");
      for (local_104 = 0; uVar13 = (ulong)local_104,
          sVar7 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::size
                            (&this->pimpl->mImporter), uVar13 < sVar7; local_104 = local_104 + 1) {
        ppBVar8 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
                  operator[](&this->pimpl->mImporter,(ulong)local_104);
        uVar5 = (*(*ppBVar8)->_vptr_BaseImporter[3])(*ppBVar8,local_48,this->pimpl->mIOHandler,1);
        if ((uVar5 & 1) != 0) {
          ppBVar8 = std::vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>::
                    operator[](&this->pimpl->mImporter,(ulong)local_104);
          pBStack_f0 = *ppBVar8;
          SetPropertyInteger(this,"importerIndex",local_104);
          break;
        }
      }
    }
    if (pBStack_f0 != (value_type)0x0) goto LAB_003c17a0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileIO,
                   "No suitable reader found for the file format of file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fileIO,
                   "\".");
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&fileIO);
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,&this->pimpl->mErrorString);
    this_local = (Importer *)0x0;
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
LAB_003c17a0:
    pIVar1 = this->pimpl->mIOHandler;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fileSize,"rb",(allocator<char> *)((long)&desc + 7));
    pIVar9 = IOSystem::Open(pIVar1,(string *)local_48,(string *)&fileSize);
    std::__cxx11::string::~string((string *)&fileSize);
    std::allocator<char>::~allocator((allocator<char> *)((long)&desc + 7));
    desc._0_4_ = 0;
    local_150 = pIVar9;
    if (pIVar9 != (IOStream *)0x0) {
      desc._0_4_ = (*pIVar9->_vptr_IOStream[6])();
      pIVar1 = this->pimpl->mIOHandler;
      (*pIVar1->_vptr_IOSystem[5])(pIVar1,local_150);
    }
    iVar4 = (*pBStack_f0->_vptr_BaseImporter[5])();
    ext.field_2._8_8_ = CONCAT44(extraout_var,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"unknown",&local_1a1);
    std::allocator<char>::~allocator(&local_1a1);
    if (ext.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=((string *)local_1a0,*(char **)ext.field_2._8_8_);
    }
    pLVar6 = DefaultLogger::get();
    std::operator+(&local_1e8,"Found a matching importer for this file format: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    std::operator+(&local_1c8,&local_1e8,".");
    Logger::info(pLVar6,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    pPVar2 = this->pimpl->mProgressHandler;
    (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,0,(ulong)(uint)desc);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
    if (bVar3) {
      pPVar12 = std::
                unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ::operator->(&local_b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"import",&local_209);
      Profiling::Profiler::BeginRegion(pPVar12,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    paVar10 = BaseImporter::ReadFile(pBStack_f0,this,(string *)local_48,this->pimpl->mIOHandler);
    this->pimpl->mScene = paVar10;
    pPVar2 = this->pimpl->mProgressHandler;
    (*pPVar2->_vptr_ProgressHandler[3])(pPVar2,(ulong)(uint)desc);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
    if (bVar3) {
      pPVar12 = std::
                unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ::operator->(&local_b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"import",(allocator<char> *)((long)&ds.mScene + 7));
      Profiling::Profiler::EndRegion(pPVar12,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ds.mScene + 7));
    }
    SetPropertyString(this,"sourceFilePath",(string *)local_48);
    if (this->pimpl->mScene == (aiScene *)0x0) {
      if (this->pimpl->mScene == (aiScene *)0x0) {
        psVar11 = BaseImporter::GetErrorText_abi_cxx11_(pBStack_f0);
        std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)psVar11);
      }
LAB_003c1ed9:
      SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
      if (bVar3) {
        pPVar12 = std::
                  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                  ::operator->(&local_b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"total",&local_2d1);
        Profiling::Profiler::EndRegion(pPVar12,&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
      }
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 0;
    }
    else {
      if ((pFile.field_2._12_4_ & 0x400) == 0) {
LAB_003c1cd6:
        bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
        if (bVar3) {
          pPVar12 = std::
                    unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                    ::operator->(&local_b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_278,"preprocess",(allocator<char> *)((long)&pre.scene + 7));
          Profiling::Profiler::BeginRegion(pPVar12,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator((allocator<char> *)((long)&pre.scene + 7));
        }
        ScenePreprocessor::ScenePreprocessor(&local_288,this->pimpl->mScene);
        ScenePreprocessor::ProcessScene(&local_288);
        bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_b0);
        if (bVar3) {
          pPVar12 = std::
                    unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                    ::operator->(&local_b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"preprocess",&local_2a9);
          Profiling::Profiler::EndRegion(pPVar12,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
        }
        ApplyPostProcessing(this,pFile.field_2._12_4_ & 0xfffffbff);
        goto LAB_003c1ed9;
      }
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)local_258);
      BaseProcess::ExecuteOnScene((BaseProcess *)local_258,this);
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_ =
           this->pimpl->mScene == (aiScene *)0x0;
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_1_) {
        this_local = (Importer *)0x0;
      }
      profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._5_3_ = 0;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)local_258);
      if (profiler._M_t.
          super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ == 0)
      goto LAB_003c1cd6;
    }
    std::__cxx11::string::~string((string *)local_1a0);
  }
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr(&local_b0);
  if (profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ == 0) {
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ = 0;
  }
LAB_003c1fe3:
  std::__cxx11::string::~string((string *)local_48);
  if (profiler._M_t.
      super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl._4_4_ == 0) {
    this_local = (Importer *)this->pimpl->mScene;
  }
  return (aiScene *)this_local;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return NULL;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = NULL;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return NULL;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( NULL != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure)
            {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return NULL;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e)
    {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = NULL;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}